

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fApiCase.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::ApiCase::expectError(ApiCase *this,deUint32 expected0,deUint32 expected1)

{
  ostringstream *this_00;
  TestContext *this_01;
  GLenum GVar1;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  GVar1 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
  if (GVar1 != expected1 && GVar1 != expected0) {
    local_1a8._0_8_ = this->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"// ERROR: expected ");
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = expected0;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::operator<<((ostream *)this_00," or ");
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = expected1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Got invalid error");
    }
  }
  return;
}

Assistant:

void ApiCase::expectError (deUint32 expected0, deUint32 expected1)
{
	deUint32 err = glGetError();
	if (err != expected0 && err != expected1)
	{
		m_log << tcu::TestLog::Message << "// ERROR: expected " << glu::getErrorStr(expected0) << " or " << glu::getErrorStr(expected1) << tcu::TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid error");
	}
}